

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O0

LY_ERR lyd_create_inner(lysc_node *schema,lyd_node **node)

{
  lyd_node *node_00;
  lyd_node_inner *in;
  lyd_node **node_local;
  lysc_node *schema_local;
  
  if ((schema->nodetype & 0x711) != 0) {
    node_00 = (lyd_node *)calloc(1,0x48);
    if (node_00 == (lyd_node *)0x0) {
      ly_log(schema->module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lyd_create_inner");
      schema_local._4_4_ = LY_EMEM;
    }
    else {
      node_00->schema = schema;
      node_00->prev = node_00;
      node_00->flags = 4;
      if ((schema->nodetype == 1) && ((schema->flags & 0x80) == 0)) {
        node_00->flags = node_00->flags | 1;
      }
      if ((schema->nodetype != 0x10) || ((schema->flags & 0x200) != 0)) {
        lyd_hash(node_00);
      }
      *node = node_00;
      schema_local._4_4_ = LY_SUCCESS;
    }
    return schema_local._4_4_;
  }
  __assert_fail("schema->nodetype & LYD_NODE_INNER",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                ,0x74,"LY_ERR lyd_create_inner(const struct lysc_node *, struct lyd_node **)");
}

Assistant:

LY_ERR
lyd_create_inner(const struct lysc_node *schema, struct lyd_node **node)
{
    struct lyd_node_inner *in;

    assert(schema->nodetype & LYD_NODE_INNER);

    in = calloc(1, sizeof *in);
    LY_CHECK_ERR_RET(!in, LOGMEM(schema->module->ctx), LY_EMEM);

    in->schema = schema;
    in->prev = &in->node;
    in->flags = LYD_NEW;
    if ((schema->nodetype == LYS_CONTAINER) && !(schema->flags & LYS_PRESENCE)) {
        in->flags |= LYD_DEFAULT;
    }

    /* do not hash list with keys, we need them for the hash */
    if ((schema->nodetype != LYS_LIST) || (schema->flags & LYS_KEYLESS)) {
        lyd_hash(&in->node);
    }

    *node = &in->node;
    return LY_SUCCESS;
}